

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalNearTrim(int nNear,char *aTmp,char **paPoslist,int *pnToken,Fts3Phrase *pPhrase)

{
  int iVar1;
  char *pcStack_50;
  int res;
  char *pOut;
  char *p2;
  int local_38;
  int nNew;
  int nParam2;
  int nParam1;
  Fts3Phrase *pPhrase_local;
  int *pnToken_local;
  char **paPoslist_local;
  char *aTmp_local;
  int nNear_local;
  
  nNew = nNear + pPhrase->nToken;
  local_38 = nNear + *pnToken;
  pcStack_50 = (pPhrase->doclist).pList;
  pOut = pcStack_50;
  _nParam2 = pPhrase;
  pPhrase_local = (Fts3Phrase *)pnToken;
  pnToken_local = (int *)paPoslist;
  paPoslist_local = (char **)aTmp;
  aTmp_local._4_4_ = nNear;
  iVar1 = fts3PoslistNearMerge(&stack0xffffffffffffffb0,aTmp,nNew,local_38,paPoslist,&pOut);
  if (iVar1 != 0) {
    p2._4_4_ = ((int)pcStack_50 - (int)(_nParam2->doclist).pList) + -1;
    memset((_nParam2->doclist).pList + p2._4_4_,0,(long)((_nParam2->doclist).nList - p2._4_4_));
    (_nParam2->doclist).nList = p2._4_4_;
    *(char **)pnToken_local = (_nParam2->doclist).pList;
    *(int *)&(pPhrase_local->doclist).aAll = _nParam2->nToken;
  }
  return iVar1;
}

Assistant:

static int fts3EvalNearTrim(
  int nNear,                      /* NEAR distance. As in "NEAR/nNear". */
  char *aTmp,                     /* Temporary space to use */
  char **paPoslist,               /* IN/OUT: Position list */
  int *pnToken,                   /* IN/OUT: Tokens in phrase of *paPoslist */
  Fts3Phrase *pPhrase             /* The phrase object to trim the doclist of */
){
  int nParam1 = nNear + pPhrase->nToken;
  int nParam2 = nNear + *pnToken;
  int nNew;
  char *p2; 
  char *pOut; 
  int res;

  assert( pPhrase->doclist.pList );

  p2 = pOut = pPhrase->doclist.pList;
  res = fts3PoslistNearMerge(
    &pOut, aTmp, nParam1, nParam2, paPoslist, &p2
  );
  if( res ){
    nNew = (int)(pOut - pPhrase->doclist.pList) - 1;
    assert( pPhrase->doclist.pList[nNew]=='\0' );
    assert( nNew<=pPhrase->doclist.nList && nNew>0 );
    memset(&pPhrase->doclist.pList[nNew], 0, pPhrase->doclist.nList - nNew);
    pPhrase->doclist.nList = nNew;
    *paPoslist = pPhrase->doclist.pList;
    *pnToken = pPhrase->nToken;
  }

  return res;
}